

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

int __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::remove(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
         *this,char *__filename)

{
  int iVar1;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar2;
  undefined4 extraout_var;
  bool bVar3;
  long in_RDX;
  long lVar4;
  int64_t rdays;
  long lVar5;
  int64_t rmonths;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t lmicros;
  long lVar9;
  char *__filename_00;
  bool bVar10;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNode;
  
  lVar4 = (this->_value).second.micros;
  lVar6 = (long)(this->_value).second.days + lVar4 / 86400000000;
  lVar5 = lVar6 % 0x1e;
  lVar7 = (long)(this->_value).second.months + lVar6 / 0x1e;
  lVar6 = (long)*(int *)(in_RDX + 0xc) + *(long *)(in_RDX + 0x10) / 86400000000;
  pNVar2 = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
            *)(lVar6 % 0x1e);
  lVar6 = (long)*(int *)(in_RDX + 8) + lVar6 / 0x1e;
  if ((lVar6 < lVar7) ||
     ((lVar6 <= lVar7 &&
      (((long)pNVar2 < lVar5 ||
       (((long)pNVar2 <= lVar5 && (*(long *)(in_RDX + 0x10) % 86400000000 < lVar4 % 86400000000)))))
      ))) {
    pNode = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             *)0x0;
  }
  else {
    bVar3 = __filename == (char *)0xffffffffffffffff;
    if (bVar3) {
      pNode = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
               *)0x0;
    }
    else {
      lVar4 = (long)__filename << 4;
      __filename_00 = __filename;
      do {
        pNVar2 = *(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                   **)((long)&((this->_nodeRefs)._nodes.
                               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->pNode + lVar4);
        if (pNVar2 != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                       *)0x0) {
          iVar1 = remove(pNVar2,__filename_00);
          pNode = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                   *)CONCAT44(extraout_var,iVar1);
          if (pNode != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                        *)0x0) {
            pNVar2 = _adjRemoveRefs(this,(size_t)__filename_00,pNode);
            goto LAB_004fa3f2;
          }
        }
        lVar4 = lVar4 + -0x10;
        pNVar2 = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                  *)(__filename_00 + -1);
        bVar3 = pNVar2 == (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                           *)0xffffffffffffffff;
        bVar10 = __filename_00 != (char *)0x0;
        __filename_00 = __filename_00 + -1;
      } while (bVar10);
      pNode = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
               *)0x0;
    }
LAB_004fa3f2:
    if (!bVar3) {
      return (int)pNVar2;
    }
  }
  if (__filename != (char *)0x0) {
    return 0;
  }
  if (pNode != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                *)0x0) {
    return 0;
  }
  lVar4 = (this->_value).second.micros;
  lVar6 = (long)(this->_value).second.days + lVar4 / 86400000000;
  lVar4 = lVar4 % 86400000000;
  lVar7 = lVar6 % 0x1e;
  lVar8 = (long)(this->_value).second.months + lVar6 / 0x1e;
  lVar5 = (long)*(int *)(in_RDX + 0xc) + *(long *)(in_RDX + 0x10) / 86400000000;
  lVar9 = *(long *)(in_RDX + 0x10) % 86400000000;
  lVar6 = lVar5 % 0x1e;
  lVar5 = (long)*(int *)(in_RDX + 8) + lVar5 / 0x1e;
  if ((lVar8 <= lVar5) &&
     ((lVar8 < lVar5 || ((lVar7 <= lVar6 && ((lVar7 < lVar6 || (lVar4 <= lVar9)))))))) {
    bVar3 = lVar8 < lVar5;
    if (lVar5 == lVar8) {
      if (lVar7 < lVar6) {
        return 0;
      }
      bVar3 = lVar4 < lVar9 && lVar7 <= lVar6;
    }
    if (!bVar3) {
      (this->_nodeRefs)._swapLevel = 0;
      return (int)this;
    }
  }
  return 0;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::remove(size_t call_level,
                         const T &value) {
    assert(_nodeRefs.height());
    assert(_nodeRefs.noNodePointerMatches(this));

    Node<T, _Compare> *pNode = nullptr;
    // Effectively: if (value >= _value) {
    if (!_compare(value, _value)) {
        for (size_t level = call_level + 1; level-- > 0;) {
            if (_nodeRefs[level].pNode) {
                // Make progress to the right
                pNode = _nodeRefs[level].pNode->remove(level, value);
                if (pNode) {
                    return _adjRemoveRefs(level, pNode);
                }
            }
            // Make progress down
        }
    }
    if (! pNode) { // Base case
        // We only admit to being the node to remove if the caller is
        // approaching us from level 0. It is entirely likely that
        // the same (or an other) caller can see us at a higher level
        // but the recursion stack will not have been set up in the correct
        // step wise fashion so that the lower level references will
        // not be swapped.
        // Effectively: if (call_level == 0 && value == _value) {
        if (call_level == 0 && !_compare(value, _value) && !_compare(_value, value)) {
            _nodeRefs.resetSwapLevel();
            return this;
        }
    }
    assert(pNode == nullptr);
    return nullptr;
}